

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O0

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  undefined1 local_118 [8];
  stbi__context s;
  uchar *result;
  int *z_local;
  int *y_local;
  int *x_local;
  int **delays_local;
  int len_local;
  stbi_uc *buffer_local;
  
  stbi__start_mem((stbi__context *)local_118,buffer,len);
  s.img_buffer_original_end =
       (stbi_uc *)stbi__load_gif_main((stbi__context *)local_118,delays,x,y,z,comp,req_comp);
  if (stbi__vertically_flip_on_load != 0) {
    stbi__vertical_flip_slices(s.img_buffer_original_end,*x,*y,*z,*comp);
  }
  return s.img_buffer_original_end;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s; 
   stbi__start_mem(&s,buffer,len); 
   
   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp ); 
   }

   return result; 
}